

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

int pkey_gost_omac_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2,size_t max_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  short *psVar4;
  EVP_MD *pEVar5;
  code *UNRECOVERED_JUMPTABLE;
  EVP_PKEY *pkey;
  undefined8 uVar6;
  int reason;
  
  psVar4 = (short *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  iVar3 = 1;
  switch(type) {
  case 1:
    iVar3 = EVP_MD_get_type(p2);
    if (((iVar3 - 0x497U < 0x12) && ((0x20009U >> (iVar3 - 0x497U & 0x1f) & 1) != 0)) ||
       (iVar3 == 0x3f9)) {
      *(void **)(psVar4 + 4) = p2;
      return 1;
    }
    reason = 0x70;
    iVar3 = 800;
    break;
  case 2:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    return -2;
  case 3:
  case 4:
  case 5:
    goto switchD_00111b31_caseD_3;
  case 6:
    if (p1 == 0x20) {
      uVar6 = *p2;
      uVar1 = *(undefined8 *)((long)p2 + 8);
      uVar2 = *(undefined8 *)((long)p2 + 0x18);
      *(undefined8 *)(psVar4 + 0x10) = *(undefined8 *)((long)p2 + 0x10);
      *(undefined8 *)(psVar4 + 0x14) = uVar2;
      *(undefined8 *)(psVar4 + 8) = uVar6;
      *(undefined8 *)(psVar4 + 0xc) = uVar1;
      *psVar4 = 1;
      return 1;
    }
    reason = 0x72;
    iVar3 = 0x331;
    break;
  case 7:
    if (*psVar4 != 0) {
      pEVar5 = EVP_MD_CTX_md((EVP_MD_CTX *)p2);
      UNRECOVERED_JUMPTABLE = (code *)EVP_MD_meth_get_ctrl(pEVar5);
      psVar4 = psVar4 + 8;
      uVar6 = 0x20;
LAB_00111c05:
      iVar3 = (*UNRECOVERED_JUMPTABLE)(p2,0x1004,uVar6,psVar4);
      return iVar3;
    }
    pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx);
    if (pkey == (EVP_PKEY *)0x0) {
      reason = 0x79;
      iVar3 = 0x340;
    }
    else {
      psVar4 = (short *)EVP_PKEY_get0(pkey);
      if (psVar4 != (short *)0x0) {
        pEVar5 = EVP_MD_CTX_md((EVP_MD_CTX *)p2);
        UNRECOVERED_JUMPTABLE = (code *)EVP_MD_meth_get_ctrl(pEVar5);
        uVar6 = 0;
        goto LAB_00111c05;
      }
      reason = 0x79;
      iVar3 = 0x346;
    }
    break;
  case 0xd:
    *(undefined8 *)p2 = *(undefined8 *)(psVar4 + 4);
    return 1;
  default:
    if (type != 0x1005) {
      return -2;
    }
    if ((uint)p1 <= max_size && 0 < p1) {
      psVar4[1] = (short)p1;
      return 1;
    }
    reason = 0x75;
    iVar3 = 0x354;
  }
  ERR_GOST_error(0x8b,reason,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                 ,iVar3);
  iVar3 = 0;
switchD_00111b31_caseD_3:
  return iVar3;
}

Assistant:

static int pkey_gost_omac_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2, size_t max_size)
{
    struct gost_mac_pmeth_data *data =
        (struct gost_mac_pmeth_data *)EVP_PKEY_CTX_get_data(ctx);

    switch (type) {
    case EVP_PKEY_CTRL_MD:
        {
            int nid = EVP_MD_type((const EVP_MD *)p2);
            if (nid != NID_magma_mac && nid != NID_grasshopper_mac
                && nid != NID_id_tc26_cipher_gostr3412_2015_kuznyechik_ctracpkm_omac /* FIXME beldmit */
                && nid != NID_id_tc26_cipher_gostr3412_2015_magma_ctracpkm_omac) {
                GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                        GOST_R_INVALID_DIGEST_TYPE);
                return 0;
            }
            data->md = (EVP_MD *)p2;
            return 1;
        }

    case EVP_PKEY_CTRL_GET_MD:
        *(const EVP_MD **)p2 = data->md;
        return 1;

    case EVP_PKEY_CTRL_PKCS7_ENCRYPT:
    case EVP_PKEY_CTRL_PKCS7_DECRYPT:
    case EVP_PKEY_CTRL_PKCS7_SIGN:
        return 1;
    case EVP_PKEY_CTRL_SET_MAC_KEY:
        if (p1 != 32) {
            GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL, GOST_R_INVALID_MAC_KEY_LENGTH);
            return 0;
        }

        memcpy(data->key, p2, 32);
        data->key_set = 1;
        return 1;
    case EVP_PKEY_CTRL_DIGESTINIT:
        {
            EVP_MD_CTX *mctx = p2;
            if (!data->key_set) {
                struct gost_mac_key *key;
                EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);
                if (!pkey) {
                    GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                            GOST_R_MAC_KEY_NOT_SET);
                    return 0;
                }
                key = EVP_PKEY_get0(pkey);
                if (!key) {
                    GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL,
                            GOST_R_MAC_KEY_NOT_SET);
                    return 0;
                }
                return EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
                    (mctx, EVP_MD_CTRL_SET_KEY, 0, key);
            } else {
                return EVP_MD_meth_get_ctrl(EVP_MD_CTX_md(mctx))
                    (mctx, EVP_MD_CTRL_SET_KEY, 32, &(data->key));
            }
        }
    case EVP_PKEY_CTRL_MAC_LEN:
        {
            if (p1 < 1 || p1 > max_size) {

                GOSTerr(GOST_F_PKEY_GOST_OMAC_CTRL, GOST_R_INVALID_MAC_SIZE);
                return 0;
            }
            data->mac_size = p1;
            return 1;
        }
    }
    return -2;
}